

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  iterator iVar6;
  ConfigurePreset *pCVar7;
  TestPreset *pTVar8;
  PackagePreset *pPVar9;
  BuildPreset *pBVar10;
  ostream *poVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *this_00;
  undefined8 uVar15;
  undefined8 uVar16;
  WorkflowStep *step;
  long lVar17;
  pointer pCVar18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  static_string_view type;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view type_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  static_string_view type_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  static_string_view type_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  int stepNumber;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmCMakePresetsGraph settingsFile;
  allocator_type local_35d;
  int local_35c;
  undefined1 local_358 [32];
  _Any_data local_338;
  undefined1 local_328 [40];
  undefined1 local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  cmExternalMakefileProjectGeneratorFactory **local_2e0;
  pointer local_2d8;
  cmExternalMakefileProjectGeneratorFactory *local_2d0;
  char *local_2c8;
  _Base_ptr local_2c0;
  pointer local_2b8;
  undefined1 local_2b0 [16];
  _Alloc_hider local_2a0;
  _Base_ptr local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  static_string_view local_280;
  undefined4 local_26c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [56];
  pointer pEStack_208;
  pointer local_200;
  pointer pEStack_1f8;
  _Alloc_hider local_1f0;
  _func_int **local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  local_1d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  local_1a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  local_170;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  local_110;
  pointer pbStack_e0;
  pointer local_d8;
  pointer pbStack_d0;
  pointer local_c8;
  pointer pbStack_c0;
  pointer local_b8;
  pointer pbStack_b0;
  pointer local_a8;
  pointer pbStack_a0;
  pointer local_98;
  pointer pbStack_90;
  pointer local_88;
  pointer pbStack_80;
  pointer local_78;
  pointer pbStack_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  cmake *pcVar14;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,(string *)local_240);
  pcVar2 = local_240 + 0x10;
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,CONCAT71(local_240._17_7_,local_240[0x10]) + 1);
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,(string *)local_240);
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,CONCAT71(local_240._17_7_,local_240[0x10]) + 1);
  }
  local_1f0._M_p = (pointer)&local_1e0;
  local_240._8_8_ = (pointer)0x0;
  local_240[0x10] = '\0';
  local_240._32_8_ = (pointer)0x0;
  local_240._40_8_ = (pointer)0x0;
  local_240._48_8_ = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = (pointer)0x0;
  pEStack_1f8 = (pointer)0x0;
  local_1e8 = (_func_int **)0x0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d0._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_170._M_t._M_impl.super__Rb_tree_header._M_header;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_170._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_110._M_impl.super__Rb_tree_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_p = (pointer)&local_58;
  local_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pbStack_80 = (pointer)0x0;
  local_98 = (pointer)0x0;
  pbStack_90 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pbStack_a0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  pbStack_b0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  pbStack_c0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  pbStack_d0 = (pointer)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbStack_e0 = (pointer)0x0;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_240._0_8_ = pcVar2;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_110._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  bVar3 = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)local_240,psVar5,false);
  if (!bVar3) {
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    cmJSONState::GetErrorMessage_abi_cxx11_
              ((string *)local_358,(cmJSONState *)(local_240 + 0x20),true);
    local_300._0_8_ = &DAT_0000001c;
    local_300._8_8_ = "Could not read presets from ";
    local_2f0._M_allocated_capacity = 0;
    local_2e0 = (cmExternalMakefileProjectGeneratorFactory **)(psVar5->_M_dataplus)._M_p;
    local_2f0._8_8_ = psVar5->_M_string_length;
    local_2d8 = (pointer)0x0;
    local_2d0 = (cmExternalMakefileProjectGeneratorFactory *)0x1;
    local_2c8 = ":";
    local_2c0 = (_Base_ptr)0x0;
    local_2b8 = (pointer)local_358._8_8_;
    local_2b0._0_8_ = local_358._0_8_;
    views._M_len = 4;
    views._M_array = (iterator)local_300;
    local_2b0._8_8_ = (_Base_ptr)local_358;
    cmCatViews((string *)&local_338,views);
    cmSystemTools::Error((string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328) {
      operator_delete(local_338._M_unused._M_object,(ulong)(local_328._0_8_ + 1));
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    iVar4 = 1;
    goto LAB_0037b599;
  }
  if (listPresets == Yes) {
    iVar4 = 0;
    cmCMakePresetsGraph::PrintWorkflowPresetList
              ((cmCMakePresetsGraph *)local_240,(PrintPrecedingNewline *)0x0);
    goto LAB_0037b599;
  }
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
          ::find(&local_110,presetName);
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_300._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1b;
    local_300._8_8_ = "No such workflow preset in ";
    local_2f0._M_allocated_capacity = 0;
    local_2e0 = (cmExternalMakefileProjectGeneratorFactory **)(psVar5->_M_dataplus)._M_p;
    local_2f0._8_8_ = psVar5->_M_string_length;
    local_2d8 = (pointer)0x0;
    local_2d0 = (cmExternalMakefileProjectGeneratorFactory *)0x3;
    local_2c8 = ": \"";
    local_2c0 = (_Base_ptr)0x0;
    local_2b0._0_8_ = (presetName->_M_dataplus)._M_p;
    local_2b8 = (pointer)presetName->_M_string_length;
    local_2b0._8_8_ = (_Base_ptr)0x0;
    local_328._0_8_ = local_328 + 8;
    local_338._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_338._8_8_ = 1;
    local_328[8] = '\"';
    local_2a0._M_p = (pointer)0x1;
    local_290._M_allocated_capacity = 0;
    views_01._M_len = 5;
    views_01._M_array = (iterator)local_300;
    local_298 = (_Base_ptr)local_328._0_8_;
    cmCatViews((string *)local_358,views_01);
    cmSystemTools::Error((string *)local_358);
  }
  else {
    if ((char)iVar6._M_node[4]._M_color != _S_black) {
      if ((char)iVar6._M_node[0x11]._M_color == _S_red) {
        local_300._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x24;
        local_300._8_8_ = "Could not evaluate workflow preset \"";
        local_2f0._M_allocated_capacity = 0;
        local_2e0 = (cmExternalMakefileProjectGeneratorFactory **)(presetName->_M_dataplus)._M_p;
        local_2f0._8_8_ = presetName->_M_string_length;
        local_2d8 = (pointer)0x0;
        local_2d0 = (cmExternalMakefileProjectGeneratorFactory *)0x1a;
        local_2c8 = "\": Invalid macro expansion";
        local_2c0 = (_Base_ptr)0x0;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_300;
        cmCatViews((string *)&local_338,views_02);
        cmSystemTools::Error((string *)&local_338);
        uVar15 = local_328._0_8_;
        uVar16 = local_338._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328) {
LAB_0037b565:
          operator_delete((void *)uVar16,
                          (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)uVar15)->_M_dataplus)._M_p + 1));
        }
      }
      else {
        if (*(char *)&iVar6._M_node[0xe]._M_left != '\0') {
          local_358._0_8_ = (pointer)0x0;
          local_358._8_8_ = (pointer)0x0;
          local_358._16_8_ = 0;
          std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::reserve
                    ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_358,
                     ((long)iVar6._M_node[0x10]._M_left - (long)iVar6._M_node[0x10]._M_parent >> 3)
                     * -0x3333333333333333);
          local_35c = 1;
          step = (WorkflowStep *)iVar6._M_node[0x10]._M_parent;
          local_250._8_8_ = iVar6._M_node[0x10]._M_left;
          if (step != (WorkflowStep *)local_250._8_8_) {
            local_26c = fresh;
            do {
              iVar4 = local_35c;
              switch(step->PresetType) {
              case Configure:
                type.super_string_view._M_str = "configure";
                type.super_string_view._M_len = 9;
                pCVar7 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                   (this,type,&local_1d0,step);
                this_00 = local_300;
                if (pCVar7 == (ConfigurePreset *)0x0) {
LAB_0037b584:
                  iVar4 = 1;
                  goto LAB_0037b58f;
                }
                psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                local_300._0_8_ = &local_2f0;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)this_00,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_2e0 = &local_2d0;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"--preset","");
                local_2c0 = (_Base_ptr)local_2b0;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2c0,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                __l._M_len = 3;
                __l._M_array = (iterator)this_00;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_338,__l,(allocator_type *)&local_268);
                local_250._M_allocated_capacity = (size_type)&step->PresetName;
                lVar17 = -0x60;
                plVar12 = (long *)local_2b0;
                do {
                  if (plVar12 != (long *)plVar12[-2]) {
                    this_00 = (char *)(*plVar12 + 1);
                    operator_delete((long *)plVar12[-2],(ulong)this_00);
                  }
                  plVar12 = plVar12 + -4;
                  lVar17 = lVar17 + 0x20;
                } while (lVar17 != 0);
                if (local_26c == Yes) {
                  this_00 = "--fresh";
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[8]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_338._M_pod_data,(char (*) [8])"--fresh");
                }
                local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x9;
                local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x875589;
                BuildWorkflowStep((function<int_()> *)local_300,(cmake *)this_00,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_338);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_358,&local_35c,(static_string_view *)&local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_250._M_allocated_capacity,(function<int_()> *)local_300);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2f0._M_allocated_capacity !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_2f0._M_allocated_capacity)
                            ((function<int_()> *)local_300,(function<int_()> *)local_300,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_338);
                break;
              case Build:
                type_02.super_string_view._M_str = "build";
                type_02.super_string_view._M_len = 5;
                pBVar10 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                    (this,type_02,&local_1a0,step);
                if (pBVar10 == (BuildPreset *)0x0) goto LAB_0037b584;
                local_280.super_string_view._M_len = 5;
                local_280.super_string_view._M_str = "build";
                psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                local_300._0_8_ = &local_2f0;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_300,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_2e0 = &local_2d0;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"--build","");
                local_2c0 = (_Base_ptr)local_2b0;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"--preset","");
                local_2a0._M_p = (pointer)&local_290;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2a0,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                pcVar14 = (cmake *)local_300;
                __l_02._M_len = 4;
                __l_02._M_array = (iterator)pcVar14;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_268,__l_02,&local_35d);
                BuildWorkflowStep((function<int_()> *)&local_338,pcVar14,&local_268);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_358,&local_35c,&local_280,&step->PresetName,
                           (function<int_()> *)&local_338);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_328._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_328._0_8_)(&local_338,&local_338,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_268);
                lVar17 = -0x80;
                paVar13 = &local_290;
                do {
                  if (paVar13 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar13->_M_allocated_capacity)[-2]) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)(&paVar13->_M_allocated_capacity)[-2],
                                    paVar13->_M_allocated_capacity + 1);
                  }
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(&paVar13->_M_allocated_capacity + -4);
                  lVar17 = lVar17 + 0x20;
                } while (lVar17 != 0);
                break;
              case Test:
                type_00.super_string_view._M_str = "test";
                type_00.super_string_view._M_len = 4;
                pTVar8 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                   (this,type_00,&local_170,step);
                if (pTVar8 == (TestPreset *)0x0) goto LAB_0037b584;
                local_280.super_string_view._M_len = 4;
                local_280.super_string_view._M_str = "test";
                psVar5 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                local_300._0_8_ = &local_2f0;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_300,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_2e0 = &local_2d0;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"--preset","");
                local_2c0 = (_Base_ptr)local_2b0;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2c0,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                pcVar14 = (cmake *)local_300;
                __l_00._M_len = 3;
                __l_00._M_array = (iterator)pcVar14;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_268,__l_00,&local_35d);
                BuildWorkflowStep((function<int_()> *)&local_338,pcVar14,&local_268);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_358,&local_35c,&local_280,&step->PresetName,
                           (function<int_()> *)&local_338);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_328._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_328._0_8_)(&local_338,&local_338,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_268);
                lVar17 = -0x60;
                plVar12 = (long *)local_2b0;
                do {
                  if (plVar12 != (long *)plVar12[-2]) {
                    operator_delete((long *)plVar12[-2],*plVar12 + 1);
                  }
                  plVar12 = plVar12 + -4;
                  lVar17 = lVar17 + 0x20;
                } while (lVar17 != 0);
                break;
              case Package:
                type_01.super_string_view._M_str = "package";
                type_01.super_string_view._M_len = 7;
                pPVar9 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                   (this,type_01,&local_140,step);
                if (pPVar9 == (PackagePreset *)0x0) goto LAB_0037b584;
                local_280.super_string_view._M_len = 7;
                local_280.super_string_view._M_str = "package";
                psVar5 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                local_300._0_8_ = &local_2f0;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_300,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_2e0 = &local_2d0;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"--preset","");
                local_2c0 = (_Base_ptr)local_2b0;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2c0,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                pcVar14 = (cmake *)local_300;
                __l_01._M_len = 3;
                __l_01._M_array = (iterator)pcVar14;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_268,__l_01,&local_35d);
                BuildWorkflowStep((function<int_()> *)&local_338,pcVar14,&local_268);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_358,&local_35c,&local_280,&step->PresetName,
                           (function<int_()> *)&local_338);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_328._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_328._0_8_)(&local_338,&local_338,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_268);
                lVar17 = -0x60;
                plVar12 = (long *)local_2b0;
                do {
                  if (plVar12 != (long *)plVar12[-2]) {
                    operator_delete((long *)plVar12[-2],*plVar12 + 1);
                  }
                  plVar12 = plVar12 + -4;
                  lVar17 = lVar17 + 0x20;
                } while (lVar17 != 0);
              }
              local_35c = iVar4 + 1;
              step = step + 1;
            } while (step != (WorkflowStep *)local_250._8_8_);
          }
          uVar15 = local_358._8_8_;
          if (local_358._0_8_ == local_358._8_8_) {
            iVar4 = 0;
          }
          else {
            bVar3 = true;
            pCVar18 = (pointer)local_358._0_8_;
            do {
              if (!bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Executing workflow step ",0x18);
              poVar11 = (ostream *)std::ostream::operator<<(&std::cout,pCVar18->StepNumber);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," of ",4);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(pCVar18->Type).super_string_view._M_str,
                                   (pCVar18->Type).super_string_view._M_len);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," preset \"",9);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(pCVar18->Name)._M_dataplus._M_p,
                                   (pCVar18->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n\n",3);
              std::ostream::flush();
              if ((pCVar18->Action).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              iVar4 = (*(pCVar18->Action)._M_invoker)((_Any_data *)&pCVar18->Action);
              if (iVar4 != 0) break;
              pCVar18 = pCVar18 + 1;
              bVar3 = false;
              iVar4 = 0;
            } while (pCVar18 != (pointer)uVar15);
          }
LAB_0037b58f:
          std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector
                    ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_358);
          goto LAB_0037b599;
        }
        psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        local_338._M_pod_data[0] = 0x22;
        cmStrCat<char_const(&)[40],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                  ((string *)local_300,(char (*) [40])"Cannot use disabled workflow preset in ",
                   psVar5,(char (*) [4])0x8cb7b4,presetName,local_338._M_pod_data);
        cmSystemTools::Error((string *)local_300);
        uVar15 = local_2f0._M_allocated_capacity;
        uVar16 = local_300._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._0_8_ != &local_2f0) goto LAB_0037b565;
      }
      iVar4 = 1;
      cmCMakePresetsGraph::PrintWorkflowPresetList
                ((cmCMakePresetsGraph *)local_240,(PrintPrecedingNewline *)0x0);
      goto LAB_0037b599;
    }
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_300._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x25;
    local_300._8_8_ = "Cannot use hidden workflow preset in ";
    local_2f0._M_allocated_capacity = 0;
    local_2e0 = (cmExternalMakefileProjectGeneratorFactory **)(psVar5->_M_dataplus)._M_p;
    local_2f0._8_8_ = psVar5->_M_string_length;
    local_2d8 = (pointer)0x0;
    local_2d0 = (cmExternalMakefileProjectGeneratorFactory *)0x3;
    local_2c8 = ": \"";
    local_2c0 = (_Base_ptr)0x0;
    local_2b0._0_8_ = (presetName->_M_dataplus)._M_p;
    local_2b8 = (pointer)presetName->_M_string_length;
    local_2b0._8_8_ = (_Base_ptr)0x0;
    local_328._0_8_ = local_328 + 8;
    local_338._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_338._8_8_ = 1;
    local_328[8] = '\"';
    local_2a0._M_p = (pointer)0x1;
    local_290._M_allocated_capacity = 0;
    views_00._M_len = 5;
    views_00._M_array = (iterator)local_300;
    local_298 = (_Base_ptr)local_328._0_8_;
    cmCatViews((string *)local_358,views_00);
    cmSystemTools::Error((string *)local_358);
  }
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
  }
  iVar4 = 1;
  cmCMakePresetsGraph::PrintWorkflowPresetList
            ((cmCMakePresetsGraph *)local_240,(PrintPrecedingNewline *)0x0);
LAB_0037b599:
  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_240);
  return iVar4;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != true) {
    cmSystemTools::Error(cmStrCat("Could not read presets from ",
                                  this->GetHomeDirectory(), ":",
                                  settingsFile.parseState.GetErrorMessage()));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}